

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

bool __thiscall deqp::egl::GLES2ThreadTest::FenceSync::waitReady(FenceSync *this,EGLThread *thread)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_9d8;
  int local_844;
  EGLSyncKHR pvStack_840;
  EGLint destroyResult;
  EGLDisplay local_838;
  MessageBuilder local_830;
  MessageBuilder local_6a0;
  int local_50c;
  EGLSyncKHR pvStack_508;
  EGLint result_1;
  EGLDisplay local_500;
  MessageBuilder local_4f8;
  MessageBuilder local_368;
  int local_1d4;
  EGLSyncKHR pvStack_1d0;
  EGLint result;
  EGLDisplay local_1c8 [3];
  MessageBuilder local_1b0;
  bool local_19;
  EGLThread *pEStack_18;
  bool ok;
  EGLThread *thread_local;
  FenceSync *this_local;
  
  local_19 = true;
  pEStack_18 = thread;
  thread_local = (EGLThread *)this;
  if ((this->m_serverSync & 1U) == 0) {
    tcu::ThreadUtil::Thread::newMessage(&local_4f8,&thread->super_Thread);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (&local_4f8,(char (*) [31])"Begin -- eglClientWaitSyncKHR(");
    local_500 = this->m_display;
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(unsigned_long *)&local_500);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
    pvStack_508 = this->m_sync;
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar1,(unsigned_long *)&stack0xfffffffffffffaf8);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar1,(char (*) [49])", EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, 1000 000 000)");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4f8);
    local_50c = (*pEStack_18->egl->_vptr_Library[4])
                          (pEStack_18->egl,this->m_display,this->m_sync,1,1000000000);
    tcu::ThreadUtil::Thread::newMessage(&local_6a0,&pEStack_18->super_Thread);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_6a0,(char (*) [8])"End -- ");
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,&local_50c);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar1,(char (*) [26])" = eglClientWaitSyncKHR()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_6a0);
    local_19 = local_50c == 0x30f6;
  }
  else {
    tcu::ThreadUtil::Thread::newMessage(&local_1b0,&thread->super_Thread);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [25])"Begin -- eglWaitSyncKHR(");
    local_1c8[0] = this->m_display;
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(unsigned_long *)local_1c8);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
    pvStack_1d0 = this->m_sync;
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar1,(unsigned_long *)&stack0xfffffffffffffe30);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(char (*) [5])0x2c01243);
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
    local_1d4 = (*pEStack_18->egl->_vptr_Library[0x3a])
                          (pEStack_18->egl,this->m_display,this->m_sync,0);
    tcu::ThreadUtil::Thread::newMessage(&local_368,&pEStack_18->super_Thread);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_368,(char (*) [8])"End -- ");
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,&local_1d4);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar1,(char (*) [20])" = eglWaitSyncKHR()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_368);
    local_19 = local_1d4 == 1;
  }
  de::Mutex::lock(&this->m_lock);
  this->m_waiterCount = this->m_waiterCount + -1;
  if (this->m_waiterCount == 0) {
    tcu::ThreadUtil::Thread::newMessage(&local_830,&pEStack_18->super_Thread);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (&local_830,(char (*) [28])"Begin -- eglDestroySyncKHR(");
    local_838 = this->m_display;
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(unsigned_long *)&local_838);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
    pvStack_840 = this->m_sync;
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar1,(unsigned_long *)&stack0xfffffffffffff7c0);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a85ff4);
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_830);
    local_844 = (*pEStack_18->egl->_vptr_Library[0x18])
                          (pEStack_18->egl,this->m_display,this->m_sync);
    tcu::ThreadUtil::Thread::newMessage(&local_9d8,&pEStack_18->super_Thread);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_9d8,(char (*) [8])"End -- ");
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,&local_844);
    pMVar1 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar1,(char (*) [23])" = eglDestroySyncKHR()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar1,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_9d8);
    this->m_sync = (EGLSyncKHR)0x0;
  }
  de::Mutex::unlock(&this->m_lock);
  return (bool)(local_19 & 1);
}

Assistant:

bool FenceSync::waitReady (EGLThread& thread)
{
	bool ok = true;
	if (m_serverSync)
	{
		thread.newMessage() << "Begin -- eglWaitSyncKHR(" << ((size_t)m_display) << ", " << ((size_t)m_sync) << ", 0)" << tcu::ThreadUtil::Message::End;
		EGLint result = thread.egl.waitSyncKHR(m_display, m_sync, 0);
		thread.newMessage() << "End -- " << result << " = eglWaitSyncKHR()" << tcu::ThreadUtil::Message::End;
		ok = result == EGL_TRUE;
	}
	else
	{
		thread.newMessage() << "Begin -- eglClientWaitSyncKHR(" << ((size_t)m_display) << ", " << ((size_t)m_sync) << ", EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, 1000 000 000)" << tcu::ThreadUtil::Message::End;
		EGLint result = thread.egl.clientWaitSyncKHR(m_display, m_sync, EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, 1000000000);
		thread.newMessage() << "End -- " << result << " = eglClientWaitSyncKHR()" << tcu::ThreadUtil::Message::End;
		ok = result == EGL_CONDITION_SATISFIED_KHR;
	}

	m_lock.lock();
	m_waiterCount--;
	DE_ASSERT(m_waiterCount >= 0);

	if (m_waiterCount == 0)
	{
		// \note [mika] This is no longer deterministic and eglDestroySyncKHR might happen in different places and in different threads
		thread.newMessage() << "Begin -- eglDestroySyncKHR(" << ((size_t)m_display) << ", " << ((size_t)m_sync) << ")" << tcu::ThreadUtil::Message::End;
		EGLint destroyResult = thread.egl.destroySyncKHR(m_display, m_sync);
		thread.newMessage() << "End -- " << destroyResult << " = eglDestroySyncKHR()" << tcu::ThreadUtil::Message::End;
		m_sync = DE_NULL;
	}

	m_lock.unlock();

	return ok;
}